

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  MemoryManager *pMVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  div_t dVar10;
  undefined4 extraout_var_01;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar11;
  uint value;
  XMLCh *local_68;
  int local_5c;
  XMLCh *local_58;
  int local_50;
  int local_4c;
  XMLDateTime *local_48;
  ulong local_40;
  MemoryManager *local_38;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  
  iVar7 = this->fValue[7];
  uVar4 = iVar7 == 0 ^ 0x11;
  if (this->fTimeZone[1] == 0 && this->fTimeZone[0] == 0) {
    uVar4 = 0xc - (iVar7 == 0);
  }
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,(ulong)(uVar4 * 2));
  pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar2);
  local_68 = pXVar8;
  local_58 = pXVar8;
  if (0xb < this->fValue[3]) {
    local_4c = this->fValue[4];
    local_5c = 0x3c - local_4c;
    local_50 = -this->fValue[3] - (uint)(local_4c != 0);
    value = this->fValue[2] + 1;
    iVar7 = this->fValue[0];
    iVar2 = this->fValue[1];
    local_48 = this;
    local_40 = (ulong)uVar4;
    local_38 = memMgr;
    do {
      iVar3 = iVar2;
      uVar4 = maxDayInMonthFor(iVar7,iVar2);
      if ((int)value < 1) {
        iVar3 = iVar2 + -1;
        iVar5 = maxDayInMonthFor(iVar7,iVar3);
        value = iVar5 + value;
        iVar5 = -1;
        iVar6 = extraout_EDX_00;
      }
      else {
        if (value < uVar4 || value - uVar4 == 0) goto LAB_00264ea9;
        iVar5 = 1;
        value = value - uVar4;
        iVar6 = extraout_EDX;
      }
      iVar6 = modulo(iVar5 + iVar2,iVar3,iVar6);
      iVar3 = iVar6 + 0xc;
      if (0 < iVar6) {
        iVar3 = iVar6;
      }
      dVar10 = div(iVar5 + iVar2 + -1,0xc);
      iVar7 = dVar10.quot + (iVar7 - (uint)(iVar6 < 1));
      iVar2 = iVar3;
    } while( true );
  }
  iVar2 = fillYearString(this,&local_68,this->fValue[0]);
  if (iVar2 != 0) {
    iVar3 = (*memMgr->_vptr_MemoryManager[3])(memMgr,(long)(int)(uVar4 + iVar2) * 2);
    pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    local_5c = iVar7;
    memmove(pXVar9,pXVar8,(long)iVar2 * 2 + 8);
    iVar7 = local_5c;
    lVar11 = (long)local_68 - (long)pXVar8;
    (*memMgr->_vptr_MemoryManager[4])(memMgr,pXVar8);
    local_68 = (XMLCh *)(lVar11 + (long)pXVar9);
    local_58 = pXVar9;
  }
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[1],2);
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[2],2);
  if (iVar7 == 0) goto LAB_00265079;
  if (this->fTimeZone[1] == 0 && this->fTimeZone[0] == 0) {
    *local_68 = L'Z';
    local_68 = local_68 + 1;
    goto LAB_00265079;
  }
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[3],2);
  *local_68 = L':';
  iVar7 = this->fValue[4];
LAB_00265074:
  local_68 = local_68 + 1;
  fillString(this,&local_68,iVar7,2);
LAB_00265079:
  *local_68 = L'\0';
  return local_58;
LAB_00264ea9:
  if (local_4c == 0) {
    local_5c = 0;
  }
  local_50 = local_50 + 0x18;
  iVar7 = fillYearString(local_48,&local_68,iVar7);
  pMVar1 = local_38;
  if (iVar7 != 0) {
    iVar3 = (*local_38->_vptr_MemoryManager[3])(local_38,(long)((int)local_40 + iVar7) * 2);
    pXVar8 = local_58;
    pXVar9 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
    memmove(pXVar9,local_58,(long)iVar7 * 2 + 8);
    lVar11 = (long)local_68 - (long)pXVar8;
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,pXVar8);
    local_68 = (XMLCh *)(lVar11 + (long)pXVar9);
    local_58 = pXVar9;
  }
  this = local_48;
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(local_48,&local_68,iVar2,2);
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(this,&local_68,value,2);
  *local_68 = L'+';
  local_68 = local_68 + 1;
  fillString(this,&local_68,local_50,2);
  *local_68 = L':';
  iVar7 = local_5c;
  goto LAB_00265074;
}

Assistant:

XMLCh* XMLDateTime::getDateCanonicalRepresentation(MemoryManager* const memMgr) const
{
    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;
    // YYYY-MM-DD  + chNull
    // 1234567890  + 1
    int memLength = 10 + 1 + utcSize;

    if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
        // YYYY-MM-DD+HH:MM  (utcSize will be 1 so drop that)
        // 1234567890123456
        memLength += 5; // 6 - 1 for utcSize
    }

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (memLength) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    if (fValue[Hour] < 12) {

        int additionalLen = fillYearString(retPtr, fValue[CentYear]);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Month], 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Day], 2);

        if (utcSize) {
            if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
                *retPtr++ = UTC_NEG_CHAR;
                fillString(retPtr, fValue[Hour], 2);
                *retPtr++ = TIME_SEPARATOR;
                fillString(retPtr, fValue[Minute], 2);
            }
            else {
                *retPtr++ = UTC_STD_CHAR;
            }
        }
        *retPtr = chNull;
    }
    else {
        /*
         * Need to reconvert things to get a recoverable time zone between
         * +12:00 and -11:59
         */
        int carry;
        int minute;
        int hour;
        int day;
        int month;
        int year;
        if (fValue[Minute] == 0) {
            minute = 0;
            carry = 0;
        }
        else {
            minute = 60 - fValue[Minute];
            carry = 1;
        }
        hour  = 24 - fValue[Hour] - carry;
        day   = fValue[Day] + 1;
        month = fValue[Month];
        year  = fValue[CentYear];

        while (1) {
            int temp = maxDayInMonthFor(year, month);
            if (day < 1) {
                day += maxDayInMonthFor(year, month - 1);
                carry = -1;
            }
            else if (day > temp) {
                day -= temp;
                carry = 1;
            }
            else {
                break;
            }

            temp = month + carry;
            month = modulo(temp, 1, 13);
            if (month <= 0) {
                month+= 12;
                year--;
            }
            year += fQuotient(temp, 1, 13);
        }

        int additionalLen = fillYearString(retPtr, year);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, month, 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, day, 2);

        *retPtr++ = UTC_POS_CHAR;
        fillString(retPtr, hour, 2);
        *retPtr++ = TIME_SEPARATOR;
        fillString(retPtr, minute, 2);
        *retPtr = chNull;
    }
    return retBuf;
}